

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMoves.cpp
# Opt level: O1

void runTestMoves(vector<int,_std::allocator<int>_> *moves,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *expectedValues,
                 BoardSize boardSize)

{
  int *piVar1;
  Board *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pointer puVar3;
  pointer *__ptr;
  char *message;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  __single_object board;
  AssertionResult gtest_ar;
  Board *local_58;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  this = (Board *)operator_new(0x38);
  Board::Board(this,boardSize,NUMERIC);
  piVar1 = (moves->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_58 = this;
  for (piVar6 = (moves->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
    Board::checkMove(local_58,(long)(*piVar6 / 10),(long)(*piVar6 % 10));
  }
  pvVar2 = Board::getBoardValues(local_58);
  puVar3 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    lVar7 = 0;
    lVar4 = 0;
    uVar5 = 0;
    do {
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                (local_48,"values[i]","expectedValues[i]",(unsigned_long *)((long)puVar3 + lVar7),
                 (uint *)((long)(expectedValues->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar4));
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Przemyslawmd[P]Fifteen/tests/TestMoves.cpp"
                   ,0x19,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_50._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_50._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        break;
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      uVar5 = uVar5 + 1;
      puVar3 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 4;
      lVar7 = lVar7 + 8;
    } while (uVar5 < (ulong)((long)(pvVar2->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3))
    ;
  }
  if (local_58 != (Board *)0x0) {
    std::default_delete<Board>::operator()((default_delete<Board> *)&local_58,local_58);
  }
  return;
}

Assistant:

void runTestMoves(const std::vector<int>& moves, const std::vector<uint>& expectedValues, BoardSize boardSize)
{
    auto board = std::make_unique<Board>(boardSize, BoardMode::NUMERIC);
    for (int move : moves)
    {
        board->checkMove(move / 10, move % 10);
    }
    
    const auto& values = board->getBoardValues();
    for (int i = 0; i < values.size(); ++i)
    {
        ASSERT_EQ(values[i], expectedValues[i]);
    }
}